

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O3

unsigned_short __thiscall
math::wide_integer::uintwide_t::operator_cast_to_unsigned_short
          (uintwide_t<256U,_unsigned_short,_void,_true> *this)

{
  short *psVar1;
  long lVar2;
  bool bVar3;
  uintwide_t<256U,_unsigned_short,_void,_true> tmp;
  
  if (-1 < (short)(this->values).super_array<unsigned_short,_16UL>.elems[0xf]) {
    return (this->values).super_array<unsigned_short,_16UL>.elems[0];
  }
  tmp.values.super_array<unsigned_short,_16UL>.elems._0_8_ =
       *(ulong *)(this->values).super_array<unsigned_short,_16UL>.elems ^ 0xffffffffffffffff;
  tmp.values.super_array<unsigned_short,_16UL>.elems._8_8_ =
       *(ulong *)((this->values).super_array<unsigned_short,_16UL>.elems + 4) ^ 0xffffffffffffffff;
  tmp.values.super_array<unsigned_short,_16UL>.elems._16_8_ =
       *(ulong *)((this->values).super_array<unsigned_short,_16UL>.elems + 8) ^ 0xffffffffffffffff;
  tmp.values.super_array<unsigned_short,_16UL>.elems._24_8_ =
       *(ulong *)((this->values).super_array<unsigned_short,_16UL>.elems + 0xc) ^ 0xffffffffffffffff
  ;
  lVar2 = 0;
  do {
    psVar1 = (short *)((long)tmp.values.super_array<unsigned_short,_16UL>.elems + lVar2);
    *psVar1 = *psVar1 + 1;
    if (*psVar1 != 0) break;
    bVar3 = lVar2 != 0x1e;
    lVar2 = lVar2 + 2;
  } while (bVar3);
  return -tmp.values.super_array<unsigned_short,_16UL>.elems[0];
}

Assistant:

static constexpr auto is_neg(const uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>& a, // NOLINT(hicpp-named-parameter,readability-named-parameter)
                                 std::enable_if_t<RePhraseIsSigned, int>* = nullptr) -> bool             // NOLINT(hicpp-named-parameter,readability-named-parameter)
    {
      return (static_cast<std::uint_fast8_t>(static_cast<std::uint_fast8_t>(a.values.back() >> static_cast<size_t>(std::numeric_limits<typename uintwide_t<Width2, LimbType, AllocatorType, RePhraseIsSigned>::limb_type>::digits - 1)) & 1U) != 0U);
    }